

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bp_decoder_ms.c
# Opt level: O1

int bp_decode_ms_min_synd
              (mod2sparse *H,char *synd,double error_prob,int max_iter,int *converge,int *iter,
              char *decoding,double *log_prob_ratios)

{
  uint n;
  uint n_00;
  bool bVar1;
  void *__dest;
  char *pchk;
  ulong uVar2;
  double *log_prob_ratios_00;
  int iVar3;
  int local_6c;
  int local_64;
  
  n = H->n_rows;
  n_00 = H->n_cols;
  local_64 = bin_char_weight(synd,n);
  __dest = chk_alloc(n_00,8);
  log_prob_ratios_00 = (double *)0x1;
  pchk = (char *)chk_alloc(n,1);
  bp_setup_ms(H,error_prob,log_prob_ratios_00,decoding);
  if (max_iter < 1) {
    bVar1 = true;
    local_6c = 0;
  }
  else {
    bVar1 = false;
    local_6c = 0;
    do {
      bp_update_ms(H,synd,log_prob_ratios,local_6c,decoding);
      syndrome(H,decoding,pchk);
      iVar3 = 0;
      if (0 < (int)n) {
        uVar2 = 0;
        iVar3 = 0;
        do {
          iVar3 = iVar3 + (char)(pchk[uVar2] ^ synd[uVar2]);
          uVar2 = uVar2 + 1;
        } while (n != uVar2);
      }
      if (iVar3 == 0) {
        iVar3 = 1;
        goto LAB_001207b5;
      }
      if (iVar3 < local_64) {
        memcpy(__dest,log_prob_ratios,(long)(int)n_00 * 8);
        bVar1 = true;
        local_64 = iVar3;
      }
      local_6c = local_6c + 1;
    } while (local_6c != max_iter);
    bVar1 = !bVar1;
    local_6c = max_iter;
  }
  iVar3 = 0;
  if (!bVar1) {
    memcpy(log_prob_ratios,__dest,(long)(int)n_00 << 3);
  }
LAB_001207b5:
  free(pchk);
  free(__dest);
  *iter = local_6c;
  *converge = iVar3;
  return iVar3;
}

Assistant:

int bp_decode_ms_min_synd(
        mod2sparse *H,
        char *synd,
        double error_prob,
        int max_iter,
        int *converge,
        int *iter,
        char *decoding,
        double *log_prob_ratios)
{

    int M,N;
    int it;
    M = mod2sparse_rows(H);
    N = mod2sparse_cols(H);
    int hamming_weight;
    char *candidate_synd;
    double *log_prob_ratios_save;

    int decreased=0;

    int synd_weight=bin_char_weight(synd,M);
    int hamming_weight_min=synd_weight;

    log_prob_ratios_save=chk_alloc(N,sizeof(*log_prob_ratios_save));
    candidate_synd=chk_alloc(M,sizeof(*candidate_synd));

    bp_setup_ms(H,error_prob,log_prob_ratios,decoding);

    for(it=0; it<max_iter;it++)
    {
        bp_update_ms(H,synd, log_prob_ratios, it, decoding);
        syndrome(H,decoding,candidate_synd);

        hamming_weight=0;
        for(int check_no=0;check_no<M;check_no++)
        {
            hamming_weight+=synd[check_no]^candidate_synd[check_no];
        }

        if(hamming_weight==0)
        {
            free(candidate_synd);
            free(log_prob_ratios_save);
            *iter=it;
            *converge=1;
            return 1;
        }


        if(hamming_weight<hamming_weight_min){
            hamming_weight_min=hamming_weight;
            memcpy(log_prob_ratios_save,log_prob_ratios,N*sizeof(*log_prob_ratios));
            decreased=1;
        }

    }

    if(decreased) memcpy(log_prob_ratios,log_prob_ratios_save,N*sizeof(*log_prob_ratios));


    free(candidate_synd);
    free(log_prob_ratios_save);
    *iter=it;
    *converge=0;
    return 0;
}